

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setParseCaseSensitive(DecimalFormat *this,UBool value)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->parseCaseSensitive != (bool)value) {
    pDVar1->parseCaseSensitive = value != '\0';
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setParseCaseSensitive(UBool value) {
    if (UBOOL_TO_BOOL(value) == fields->properties->parseCaseSensitive) { return; }
    fields->properties->parseCaseSensitive = value;
    touchNoError();
}